

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duck_transaction.cpp
# Opt level: O3

ErrorData * __thiscall
duckdb::DuckTransaction::Rollback(ErrorData *__return_storage_ptr__,DuckTransaction *this)

{
  pointer this_00;
  
  this_00 = unique_ptr<duckdb::LocalStorage,_std::default_delete<duckdb::LocalStorage>,_true>::
            operator->(&this->storage);
  LocalStorage::Rollback(this_00);
  UndoBuffer::Rollback(&this->undo_buffer);
  ErrorData::ErrorData(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

ErrorData DuckTransaction::Rollback() {
	try {
		storage->Rollback();
		undo_buffer.Rollback();
		return ErrorData();
	} catch (std::exception &ex) {
		return ErrorData(ex);
	}
}